

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::FindLessThan
          (SkipList<unsigned_long,_leveldb::Comparator> *this,unsigned_long *key)

{
  Node *pNVar1;
  bool bVar2;
  Node *in_RAX;
  uint uVar3;
  Node *pNVar4;
  
  pNVar4 = this->head_;
  uVar3 = (this->max_height_).super___atomic_base<int>._M_i - 1;
  do {
    if ((pNVar4 != this->head_) && (*key <= pNVar4->key)) {
      __assert_fail("x == head_ || compare_(x->key, key) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                    ,0x121,
                    "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<unsigned long, leveldb::Comparator>::FindLessThan(const Key &) const [Key = unsigned long, Comparator = leveldb::Comparator]"
                   );
    }
    if ((int)uVar3 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                    ,0x9a,
                    "Node *leveldb::SkipList<unsigned long, leveldb::Comparator>::Node::Next(int) [Key = unsigned long, Comparator = leveldb::Comparator]"
                   );
    }
    pNVar1 = pNVar4->next_[uVar3]._M_b._M_p;
    if ((pNVar1 == (Node *)0x0) || (*key <= pNVar1->key)) {
      if (uVar3 == 0) {
        uVar3 = 0;
        bVar2 = false;
        in_RAX = pNVar4;
      }
      else {
        uVar3 = uVar3 - 1;
        bVar2 = true;
      }
    }
    else {
      bVar2 = true;
      pNVar4 = pNVar1;
    }
  } while (bVar2);
  return in_RAX;
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}